

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_157::FunctionDirectizer::~FunctionDirectizer(FunctionDirectizer *this)

{
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
               );
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }